

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

string * QUtil::pdf_doc_to_utf8(string *__return_storage_ptr__,string *val)

{
  byte bVar1;
  ulong uVar2;
  unsigned_short uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = val->_M_string_length;
  for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    auVar5 = std::__cxx11::string::at((ulong)val);
    bVar1 = *auVar5._0_8_;
    if ((byte)(bVar1 + 0x81) < 0x22) {
      uVar3 = pdf_doc_to_unicode[bVar1 - 0x7f];
    }
    else if ((bVar1 & 0xf8) == 0x18) {
      uVar3 = pdf_doc_low_to_unicode[bVar1 - 0x18];
    }
    else {
      uVar3 = (unsigned_short)bVar1;
      if (bVar1 == 0xad) {
        uVar3 = 0xfffd;
      }
    }
    toUTF8_abi_cxx11_(&local_50,(QUtil *)(ulong)uVar3,auVar5._8_8_);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::pdf_doc_to_utf8(std::string const& val)
{
    std::string result;
    size_t len = val.length();
    for (unsigned int i = 0; i < len; ++i) {
        unsigned char ch = static_cast<unsigned char>(val.at(i));
        unsigned short ch_short = ch;
        if ((ch >= 127) && (ch <= 160)) {
            ch_short = pdf_doc_to_unicode[ch - 127];
        } else if ((ch >= 24) && (ch <= 31)) {
            ch_short = pdf_doc_low_to_unicode[ch - 24];
        } else if (ch == 173) {
            ch_short = 0xfffd;
        }
        result += QUtil::toUTF8(ch_short);
    }
    return result;
}